

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzma_LzFind.cpp
# Opt level: O1

UInt32 crnlib::Bt3Zip_MatchFinder_GetMatches(CMatchFinder *p,UInt32 *distances)

{
  uint lenLimit;
  Byte *pBVar1;
  ushort uVar2;
  UInt32 UVar3;
  UInt32 *pUVar4;
  UInt32 UVar5;
  
  lenLimit = p->lenLimit;
  if (lenLimit < 3) {
    MatchFinder_MovePos(p);
    UVar5 = 0;
  }
  else {
    pBVar1 = p->buffer;
    uVar2 = (ushort)p->crc[pBVar1[1]] ^ CONCAT11(*pBVar1,pBVar1[2]);
    UVar3 = p->hash[uVar2];
    p->hash[uVar2] = p->pos;
    pUVar4 = GetMatchesSpec1(lenLimit,UVar3,p->pos,p->buffer,p->son,p->cyclicBufferPos,
                             p->cyclicBufferSize,p->cutValue,distances,2);
    UVar5 = (UInt32)((ulong)((long)pUVar4 - (long)distances) >> 2);
    p->cyclicBufferPos = p->cyclicBufferPos + 1;
    p->buffer = p->buffer + 1;
    UVar3 = p->pos + 1;
    p->pos = UVar3;
    if (UVar3 == p->posLimit) {
      MatchFinder_CheckLimits(p);
    }
  }
  return UVar5;
}

Assistant:

UInt32 Bt3Zip_MatchFinder_GetMatches(CMatchFinder* p, UInt32* distances) {
  UInt32 offset;
  GET_MATCHES_HEADER(3)
  HASH_ZIP_CALC;
  curMatch = p->hash[hashValue];
  p->hash[hashValue] = p->pos;
  offset = 0;
  GET_MATCHES_FOOTER(offset, 2)
}